

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack4_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (*in & 0xf) + base;
  out[1] = (*in >> 4 & 0xf) + base;
  out[2] = (*in >> 8 & 0xf) + base;
  out[3] = (*in >> 0xc & 0xf) + base;
  out[4] = (*(ushort *)((long)in + 2) & 0xf) + base;
  out[5] = (*in >> 0x14 & 0xf) + base;
  out[6] = (*(byte *)((long)in + 3) & 0xf) + base;
  out[7] = (*in >> 0x1c) + base;
  out[8] = (in[1] & 0xf) + base;
  out[9] = (in[1] >> 4 & 0xf) + base;
  out[10] = (in[1] >> 8 & 0xf) + base;
  out[0xb] = (in[1] >> 0xc & 0xf) + base;
  out[0xc] = (*(ushort *)((long)in + 6) & 0xf) + base;
  out[0xd] = (in[1] >> 0x14 & 0xf) + base;
  out[0xe] = (*(byte *)((long)in + 7) & 0xf) + base;
  out[0xf] = (in[1] >> 0x1c) + base;
  return in + 2;
}

Assistant:

uint32_t * unpack4_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}